

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall minihttp::HttpSocket::_OpenRequest(HttpSocket *this,Request *req)

{
  void *pvVar1;
  undefined4 uVar2;
  int iVar3;
  
  if (this->_inProgress != false) {
    return false;
  }
  if (((req->useSSL != true) || ((this->super_TcpSocket)._sslctx != (void *)0x0)) &&
     (iVar3 = TcpSocket::open(&this->super_TcpSocket,(req->host)._M_dataplus._M_p,req->port),
     (char)iVar3 != '\0')) {
    this->_inProgress = true;
    std::__cxx11::string::_M_assign((string *)&this->_curRequest);
    std::__cxx11::string::_M_assign((string *)&(this->_curRequest).host);
    std::__cxx11::string::_M_assign((string *)&(this->_curRequest).header);
    std::__cxx11::string::_M_assign((string *)&(this->_curRequest).resource);
    std::__cxx11::string::_M_assign((string *)&(this->_curRequest).extraGetHeaders);
    (this->_curRequest).useSSL = req->useSSL;
    uVar2 = *(undefined4 *)&req->field_0xa4;
    pvVar1 = req->user;
    (this->_curRequest).port = req->port;
    *(undefined4 *)&(this->_curRequest).field_0xa4 = uVar2;
    (this->_curRequest).user = pvVar1;
    std::__cxx11::string::_M_assign((string *)&(this->_curRequest).post);
    this->_status = 0;
    return true;
  }
  return false;
}

Assistant:

bool HttpSocket::_OpenRequest(const Request& req)
{
    if(_inProgress)
    {
        traceprint("HttpSocket::_OpenRequest(): _inProgress == true, should not be called.");
        return false;
    }
    if(req.useSSL && !hasSSL())
    {
        traceprint("HttpSocket::_OpenRequest(): Is an SSL connection, but SSL was not inited, doing that now\n");
        if(!initSSL(NULL)) // FIXME: supply cert list?
        {
            traceprint("FAILED to init SSL\n");
            return false;
        }
    }
    if(!open(req.host.c_str(), req.port))
        return false;
    _inProgress = true;
    _curRequest = req;
    _status = 0;
    return true;
}